

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.hpp
# Opt level: O3

basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> * __thiscall
jsoncons::
order_preserving_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
::at(order_preserving_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
     *this,size_t i)

{
  pointer pkVar1;
  json_runtime_error<std::out_of_range,_void> *this_00;
  ulong uVar2;
  string local_38;
  
  pkVar1 = (this->members_).
           super__Vector_base<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = ((long)(this->members_).
                 super__Vector_base<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pkVar1 >> 4) *
          -0x5555555555555555;
  if (i <= uVar2 && uVar2 - i != 0) {
    return &pkVar1[i].value_;
  }
  this_00 = (json_runtime_error<std::out_of_range,_void> *)__cxa_allocate_exception(0x18);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Invalid array subscript","");
  json_runtime_error<std::out_of_range,_void>::json_runtime_error(this_00,&local_38);
  __cxa_throw(this_00,&json_runtime_error<std::out_of_range,void>::typeinfo,
              json_runtime_error<std::out_of_range,_void>::~json_runtime_error);
}

Assistant:

void merge_or_update(iterator hint, const sorted_json_object& source)
        {
            for (auto it = source.begin(); it != source.end(); ++it)
            {
                hint = insert_or_assign(hint, (*it).key(),(*it).value());
            }
        }